

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Logger.cpp
# Opt level: O3

void Logger::initialize(void)

{
  ostream *poVar1;
  size_type *local_218;
  string logfile_filename;
  ios_base local_120 [264];
  
  std::ofstream::ofstream(&local_218);
  std::ios::swap((ios *)(&instance.logfile + *(long *)(instance._0_8_ + -0x18)));
  std::filebuf::operator=((filebuf *)&instance.field_0x8,(filebuf *)&logfile_filename);
  local_218 = _VTT;
  *(undefined8 *)((long)&local_218 + _VTT[-3]) = _strtod;
  std::filebuf::~filebuf((filebuf *)&logfile_filename);
  std::ios_base::~ios_base(local_120);
  local_218 = &logfile_filename._M_string_length;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_218,"stdout.log","");
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Writing into logfile \x1b[1m",0x19);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(char *)local_218,
                      (long)logfile_filename._M_dataplus._M_p);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\x1b[0m",4);
  std::ios::widen((char)poVar1->_vptr_basic_ostream[-3] + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  std::ofstream::open((string *)&instance,(_Ios_Openmode)&local_218);
  instance.timestamp_start = time((time_t *)0x0);
  if (local_218 != &logfile_filename._M_string_length) {
    operator_delete(local_218,logfile_filename._M_string_length + 1);
  }
  return;
}

Assistant:

void Logger::initialize() {
  instance.logfile = std::ofstream();

  std::string logfile_filename = "stdout.log";
  std::cout << "Writing into logfile " FF_BOLD << logfile_filename << F_RESET << std::endl;
  // we need to open the log file in append mode because the run_benchmark script writes values into it
  instance.logfile.open(logfile_filename, std::ios::out | std::ios::app);
  instance.timestamp_start = (unsigned long) time(nullptr);
}